

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_isResolvedCircularImportUnits_Test::~Importer_isResolvedCircularImportUnits_Test
          (Importer_isResolvedCircularImportUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, isResolvedCircularImportUnits)
{
    auto parser = libcellml::Parser::create();
    auto importer = libcellml::Importer::create();
    auto model = parser->parseModel(fileContents("importer/circularUnits_1.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto u = model->units(0);

    EXPECT_FALSE(u->isResolved());

    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(1), importer->issueCount());

    // It is possible however difficult to make a circular import with units.
    auto importModel = u->importSource()->model();
    importModel->units("u2")->importSource()->model()->units("u3")->importSource()->model()->units("i_am_cyclic")->importSource()->setModel(importModel);

    EXPECT_FALSE(u->isResolved());
    EXPECT_TRUE(model->hasUnresolvedImports());
}